

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O0

int google::SetVLOGLevel(char *module_pattern,int log_level)

{
  bool bVar1;
  size_t sVar2;
  char *pattern;
  size_t patt_len;
  VModuleInfo *this;
  bool local_62;
  bool local_61;
  int32 verbose_level__;
  VModuleInfo *info_1;
  VModuleInfo *local_30;
  VModuleInfo *info;
  MutexLock l;
  int iStack_18;
  bool found;
  int pattern_len;
  int result;
  int log_level_local;
  char *module_pattern_local;
  
  iStack_18 = fLI::FLAGS_v;
  sVar2 = strlen(module_pattern);
  l.mu_._4_4_ = (int)sVar2;
  l.mu_._3_1_ = 0;
  ::glog_internal_namespace_::MutexLock::MutexLock((MutexLock *)&info,(Mutex *)vmodule_lock);
  for (local_30 = vmodule_list; local_30 != (VModuleInfo *)0x0; local_30 = local_30->next) {
    bVar1 = std::operator==(&local_30->module_pattern,module_pattern);
    if (bVar1) {
      if ((l.mu_._3_1_ & 1) == 0) {
        iStack_18 = local_30->vlog_level;
        l.mu_._3_1_ = 1;
      }
      local_30->vlog_level = log_level;
    }
    else if ((l.mu_._3_1_ & 1) == 0) {
      pattern = (char *)std::__cxx11::string::c_str();
      patt_len = std::__cxx11::string::size();
      bVar1 = glog_internal_namespace_::SafeFNMatch_
                        (pattern,patt_len,module_pattern,(long)l.mu_._4_4_);
      if (bVar1) {
        iStack_18 = local_30->vlog_level;
        l.mu_._3_1_ = 1;
      }
    }
  }
  if ((l.mu_._3_1_ & 1) == 0) {
    this = (VModuleInfo *)operator_new(0x30);
    VModuleInfo::VModuleInfo(this);
    std::__cxx11::string::operator=((string *)this,module_pattern);
    this->vlog_level = log_level;
    this->next = vmodule_list;
    vmodule_list = this;
  }
  ::glog_internal_namespace_::MutexLock::~MutexLock((MutexLock *)&info);
  local_61 = false;
  if (0 < *SetVLOGLevel::vlocal__) {
    local_62 = true;
    if (SetVLOGLevel::vlocal__ == &kLogSiteUninitialized) {
      local_62 = InitVLOG3__(&SetVLOGLevel::vlocal__,&fLI::FLAGS_v,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/vlog_is_on.cc"
                             ,1);
    }
    local_61 = local_62;
  }
  if (local_61 != false) {
    RawLog__(0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/vlog_is_on.cc"
             ,0xc5,"Set VLOG level for \"%s\" to %d",module_pattern,(ulong)(uint)log_level);
  }
  return iStack_18;
}

Assistant:

int SetVLOGLevel(const char* module_pattern, int log_level) {
  int result = FLAGS_v;
  int const pattern_len = strlen(module_pattern);
  bool found = false;
  {
    MutexLock l(&vmodule_lock);  // protect whole read-modify-write
    for (const VModuleInfo* info = vmodule_list;
         info != NULL; info = info->next) {
      if (info->module_pattern == module_pattern) {
        if (!found) {
          result = info->vlog_level;
          found = true;
        }
        info->vlog_level = log_level;
      } else if (!found  &&
                 SafeFNMatch_(info->module_pattern.c_str(),
                              info->module_pattern.size(),
                              module_pattern, pattern_len)) {
        result = info->vlog_level;
        found = true;
      }
    }
    if (!found) {
      VModuleInfo* info = new VModuleInfo;
      info->module_pattern = module_pattern;
      info->vlog_level = log_level;
      info->next = vmodule_list;
      vmodule_list = info;
    }
  }
  RAW_VLOG(1, "Set VLOG level for \"%s\" to %d", module_pattern, log_level);
  return result;
}